

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

float duy(qnode_ptr_t p,int x,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  beaudet_t *pbVar5;
  beaudet_t *pbVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  
  iVar4 = Ix.m / 2;
  iVar7 = iVar4 * 3 + p->ofst;
  fVar9 = 0.0;
  if ((-2 < Ix.m && y < p->sizx - iVar7) && ((iVar7 <= y && iVar7 <= x) && x < p->sizy - iVar7)) {
    iVar1 = -iVar4;
    iVar7 = iVar4;
    if (iVar4 < 1) {
      iVar7 = iVar1;
    }
    iVar2 = (y + (x - iVar4) * p->res) - iVar4;
    iVar8 = iVar1;
    if (iVar4 != iVar1 && SBORROW4(iVar4,iVar1) == iVar4 * 2 < 0) {
      iVar8 = iVar4;
    }
    iVar3 = iVar4 + iVar8 + 1;
    pbVar5 = &Ix;
    iVar4 = iVar3;
    pbVar6 = pbVar5;
    iVar8 = iVar2;
    do {
      do {
        fVar9 = fVar9 + (*p->flow_ptr)[iVar2].x * pbVar5->g[0][0];
        pbVar5 = (beaudet_t *)(pbVar5->g + 1);
        iVar2 = iVar2 + 1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      iVar1 = iVar1 + 1;
      pbVar5 = (beaudet_t *)(pbVar6->g[0] + 1);
      iVar2 = iVar8 + p->res;
      iVar4 = iVar3;
      pbVar6 = pbVar5;
      iVar8 = iVar2;
    } while (iVar7 + 1 != iVar1);
  }
  return fVar9 / Ix.f;
}

Assistant:

float duy(p,x,y)
qnode_ptr_t p ;
int x, y ;

{ extern beaudet_t Ix ;
  float d ;
  int i, j, h ;

  h = Ix.m/2 ;
  d = 0.0 ;

  if (!overflow(x,y,p->sizy,p->sizx,p->ofst,h,3)) {
    for (i = -h ; i <= h ; i++) {
      for (j = -h ; j <= h ; j++) {
        d = d + (*p->flow_ptr)[p->res*(x+i) + y+j].x*Ix.g[j+h][i+h] ;
      }
    }
  }
  return(d/Ix.f) ;
}